

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

ssize_t __thiscall
webfront::http::
Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::write(Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
        *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  self;
  Response *in_stack_00000138;
  Socket *args;
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  *in_stack_ffffffffffffffb0;
  
  std::
  enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  ::shared_from_this(&this->
                      super_enable_shared_from_this<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
                    );
  args = &this->socket;
  Response::toBuffers<webfront::networking::TCPNetworkingTS>(in_stack_00000138);
  std::
  shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  ::shared_ptr((shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
                *)args,(shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
                        *)this);
  networking::TCPNetworkingTS::
  AsyncWrite<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>&,std::vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>,webfront::http::Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>::write()::_lambda(std::error_code,unsigned_long)_1_>
            (args,(vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                   *)this,(completion_handler_type *)0x12569b);
  Connection<webfront::networking::TCPNetworkingTS,webfront::fs::Multi<webfront::fs::NativeDebugFS,webfront::fs::IndexFS,webfront::fs::ReactFS,webfront::fs::BabelFS>>
  ::write()::{lambda(std::error_code,unsigned_long)#1}::~error_code
            ((completion_handler_type *)0x1256a7);
  std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::~vector(in_stack_ffffffffffffffb0);
  std::
  shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
  ::~shared_ptr((shared_ptr<webfront::http::Connection<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
                 *)0x1256bb);
  return extraout_RAX;
}

Assistant:

void write() {
        auto self(this->shared_from_this());
        Net::AsyncWrite(socket, response.toBuffers<Net>(), [this, self](std::error_code ec, std::size_t /*bytesTransferred*/) {
            if (protocol == Protocol::HTTPUpgrading) {
                protocol = Protocol::WebSocket;
                if (onUpgrade) onUpgrade(std::move(socket), protocol);
            }
            else {
                if (!ec) socket.shutdown(Net::Socket::shutdown_both);
                if (ec != Net::Error::OperationAborted) connections.stop(self);
            }
        });
    }